

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

ProgramHeaders * __thiscall pstack::Elf::Object::getSegments(Object *this,Word type)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  Word type_local;
  Object *this_local;
  
  it._M_node._4_4_ = type;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>
       ::find(&this->programHeaders,(key_type_conflict2 *)((long)&it._M_node + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>
       ::end(&this->programHeaders);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    if (getSegments(unsigned_int)::empty == '\0') {
      iVar2 = __cxa_guard_acquire(&getSegments(unsigned_int)::empty);
      if (iVar2 != 0) {
        std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::vector(&getSegments::empty);
        __cxa_atexit(std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::~vector,
                     &getSegments::empty,&__dso_handle);
        __cxa_guard_release(&getSegments(unsigned_int)::empty);
      }
    }
    this_local = (Object *)&getSegments::empty;
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>
             ::operator->(&local_28);
    this_local = (Object *)&ppVar3->second;
  }
  return (ProgramHeaders *)this_local;
}

Assistant:

const Object::ProgramHeaders &
Object::getSegments(Word type) const
{
    auto it = programHeaders.find(type);
    if (it == programHeaders.end()) {
        static const ProgramHeaders empty;
        return empty;
    }
    return it->second;
}